

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O0

bool __thiscall S2Builder::Build(S2Builder *this,S2Error *error)

{
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  value_type_conflict1 local_48 [5];
  byte local_31;
  S2LogMessage local_30;
  S2LogMessageVoidify local_19;
  S2Error *local_18;
  S2Error *error_local;
  S2Builder *this_local;
  
  local_31 = 0;
  local_18 = error;
  error_local = (S2Error *)this;
  if (error == (S2Error *)0x0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
               ,0x1ce,kFatal,(ostream *)&std::cerr);
    local_31 = 1;
    poVar2 = S2LogMessage::stream(&local_30);
    poVar2 = std::operator<<(poVar2,"Check failed: error != nullptr ");
    S2LogMessageVoidify::operator&(&local_19,poVar2);
  }
  if ((local_31 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_30);
  }
  S2Error::Clear(local_18);
  this->error_ = local_18;
  sVar3 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                    (&this->input_edges_);
  local_48[0] = (value_type_conflict1)sVar3;
  std::vector<int,_std::allocator<int>_>::push_back(&this->layer_begins_,local_48);
  if (((this->snapping_requested_ & 1U) != 0) &&
     (bVar1 = Options::idempotent(&this->options_), !bVar1)) {
    this->snapping_needed_ = true;
  }
  ChooseSites(this);
  BuildLayers(this);
  Reset(this);
  bVar1 = S2Error::ok(local_18);
  return bVar1;
}

Assistant:

bool S2Builder::Build(S2Error* error) {
  // S2_CHECK rather than S2_DCHECK because this is friendlier than crashing on the
  // "error->ok()" call below.  It would be easy to allow (error == nullptr)
  // by declaring a local "tmp_error", but it seems better to make clients
  // think about error handling.
  S2_CHECK(error != nullptr);
  error->Clear();
  error_ = error;

  // Mark the end of the last layer.
  layer_begins_.push_back(input_edges_.size());

  // See the algorithm overview at the top of this file.
  if (snapping_requested_ && !options_.idempotent()) {
    snapping_needed_ = true;
  }
  ChooseSites();
  BuildLayers();
  Reset();
  return error->ok();
}